

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O3

int Msat_SolverAddClause(Msat_Solver_t *p,Msat_IntVec_t *vLits)

{
  int iVar1;
  Msat_Clause_t *pC;
  Msat_Clause_t *local_20;
  
  iVar1 = Msat_ClauseCreate(p,vLits,0,&local_20);
  if (local_20 != (Msat_Clause_t *)0x0) {
    Msat_ClauseVecPush(p->vClauses,local_20);
  }
  return iVar1;
}

Assistant:

int  Msat_SolverAddClause( Msat_Solver_t * p, Msat_IntVec_t * vLits )
{
    Msat_Clause_t * pC; 
    int  Value;
    Value = Msat_ClauseCreate( p, vLits, 0, &pC );
    if ( pC != NULL )
        Msat_ClauseVecPush( p->vClauses, pC );
//    else if ( p->fProof )
//        Msat_ClauseCreateFake( p, vLits );
    return Value;
}